

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O2

void __thiscall brynet::net::DataSocket::closeSocket(DataSocket *this)

{
  TcpSocket *pTVar1;
  
  pTVar1 = (this->mSocket)._M_t.
           super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>.
           _M_t.
           super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
           .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl;
  if (pTVar1 != (TcpSocket *)0x0) {
    this->mCanWrite = false;
    (this->mSocket)._M_t.
    super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
    super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
    super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl = (TcpSocket *)0x0;
    (*pTVar1->_vptr_TcpSocket[1])();
    return;
  }
  return;
}

Assistant:

void DataSocket::closeSocket()
{
    if (mSocket != nullptr)
    {
        mCanWrite = false;
        mSocket = nullptr;
    }
}